

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternGridHeader.cpp
# Opt level: O0

void __thiscall PatternGridHeader::paintEvent(PatternGridHeader *this,QPaintEvent *evt)

{
  HoverKind HVar1;
  int x;
  ColorRole cr;
  int iVar2;
  Int IVar3;
  int a;
  QPalette *this_00;
  QColor *pQVar4;
  QColor *local_158;
  QColor *local_148;
  QColor *local_130;
  QLatin1Char local_f3;
  QChar local_f2;
  QArrayDataPointer<char16_t> local_f0;
  QString local_d8;
  QString local_c0;
  undefined4 local_a8;
  int local_a4;
  int textY;
  int effectsVisible;
  QColor *minusColor;
  QColor *plusColor;
  int contentWidth;
  int contentX;
  QColor *statusColor;
  int local_78;
  int iStack_74;
  bool isPlaying;
  int trackWidth;
  int track;
  int xpos;
  int h;
  QColor widgetbg;
  QPen local_40 [8];
  QPen textPen;
  QPainter painter;
  QPaintEvent *evt_local;
  PatternGridHeader *this_local;
  char16_t *str;
  
  if (this->mLayout != (PatternLayout *)0x0) {
    QPainter::QPainter((QPainter *)&textPen,(QPaintDevice *)&this->field_0x10);
    QPen::QPen(local_40,(QColor *)&this->mColorForeground1);
    this_00 = (QPalette *)QWidget::palette();
    cr = QWidget::backgroundRole();
    pQVar4 = QPalette::color(this_00,cr);
    _xpos = *(undefined8 *)pQVar4;
    widgetbg._0_8_ = *(undefined8 *)((long)&pQVar4->ct + 4);
    track = QWidget::height(&this->super_QWidget);
    iVar2 = PatternLayout::patternStart(this->mLayout);
    trackWidth = iVar2 + -1;
    for (iStack_74 = 0; iStack_74 < 4; iStack_74 = iStack_74 + 1) {
      local_78 = PatternLayout::trackWidth(this->mLayout,iStack_74);
      QPainter::setPen(&textPen);
      QPainter::drawLine((QPainter *)&textPen,trackWidth,0,trackWidth,track);
      iVar2 = trackWidth + 2;
      trackWidth = trackWidth + 1;
      QPainter::fillRect((QPainter *)&textPen,iVar2,0,local_78 + -1,track,&this->mColorBackground);
      statusColor._0_4_ =
           QFlags<ChannelOutput::Flag>::operator&(&this->mTrackFlags,1 << ((byte)iStack_74 & 0x1f));
      IVar3 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&statusColor);
      statusColor._7_1_ = IVar3 != 0;
      if ((bool)statusColor._7_1_) {
        local_130 = &this->mColorEnabled;
      }
      else {
        local_130 = &this->mColorDisabled;
      }
      _contentWidth = local_130;
      plusColor._4_4_ = trackWidth + 3;
      plusColor._0_4_ = local_78 + -5;
      QPainter::fillRect((QPainter *)&textPen,plusColor._4_4_,2,(int)plusColor,4,local_130);
      _textY = &this->mColorForeground1;
      minusColor = _textY;
      if (this->mTrackHover == iStack_74) {
        QPainter::fillRect((QPainter *)&textPen,plusColor._4_4_,track + -2,(int)plusColor,1,
                           _contentWidth);
        HVar1 = this->mHoverKind;
        if (HVar1 != track) {
          if (HVar1 == addEffect) {
            minusColor = &this->mColorForeground2;
          }
          else if (HVar1 == removeEffect) {
            _textY = &this->mColorForeground2;
          }
        }
      }
      local_a4 = PatternLayout::effectsVisible(this->mLayout,iStack_74);
      if (local_a4 == 3) {
        local_148 = (QColor *)&xpos;
      }
      else {
        local_148 = minusColor;
      }
      PatternGridHeaderTU::drawPlus((QPainter *)&textPen,plusColor._4_4_,local_148);
      if (local_a4 == 1) {
        local_158 = (QColor *)&xpos;
      }
      else {
        local_158 = _textY;
      }
      PatternGridHeaderTU::drawMinus((QPainter *)&textPen,plusColor._4_4_,local_158);
      QPainter::setPen(&textPen);
      x = plusColor._4_4_;
      iVar2 = (int)plusColor;
      local_a8 = 8;
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_f0,(Data *)0x0,L"CH%1",4);
      QString::QString(&local_d8,&local_f0);
      a = iStack_74 + 1;
      QLatin1Char::QLatin1Char(&local_f3,' ');
      QChar::QChar(&local_f2,local_f3);
      QString::arg(&local_c0,&local_d8,a,0,10,local_f2);
      QPainter::drawText((QPainter *)&textPen,x,8,iVar2,0xc,0x84,&local_c0,(QRect *)0x0);
      QString::~QString(&local_c0);
      QString::~QString(&local_d8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
      trackWidth = local_78 + trackWidth;
    }
    QPainter::setPen(&textPen);
    QPainter::drawLine((QPainter *)&textPen,trackWidth,0,trackWidth,track);
    QPen::~QPen(local_40);
    QPainter::~QPainter((QPainter *)&textPen);
  }
  return;
}

Assistant:

void PatternGridHeader::paintEvent(QPaintEvent *evt) {

    Q_UNUSED(evt);

    if (mLayout == nullptr) {
        return;
    }

    QPainter painter(this);
    QPen textPen(mColorForeground1);

    QColor widgetbg = palette().color(backgroundRole());

    auto const h = height();

    int xpos = mLayout->patternStart() - PatternLayout::LINE_WIDTH;
    for (int track = 0; track < 4; ++track) {

        auto const trackWidth = mLayout->trackWidth(track);

        painter.setPen(mLinePen);
        painter.drawLine(xpos, 0, xpos, h);
        xpos += PatternLayout::LINE_WIDTH;

        // background color
        painter.fillRect(xpos + 1, 0, trackWidth - 1, h, mColorBackground);

        bool const isPlaying = (mTrackFlags & (1 << track));
        auto const& statusColor = isPlaying ? mColorEnabled : mColorDisabled;
        auto const contentX = xpos + TU::TRACK_PADDING;
        auto const contentWidth = trackWidth - 5;
        painter.fillRect(contentX, 2, contentWidth, 4, statusColor);

        QColor *plusColor, *minusColor;
        plusColor = minusColor = &mColorForeground1;


        if (mTrackHover == track) {
            painter.fillRect(contentX, h - 2, contentWidth, 1, statusColor);
            switch (mHoverKind) {
                case HoverKind::track:
                    break;
                case HoverKind::addEffect:
                    plusColor = &mColorForeground2;
                    break;
                case HoverKind::removeEffect:
                    minusColor = &mColorForeground2;
                    break;
            }
        }
        
        auto const effectsVisible = mLayout->effectsVisible(track);
        TU::drawPlus(painter, contentX, effectsVisible != 3 ? *plusColor : widgetbg);
        TU::drawMinus(painter, contentX, effectsVisible != 1 ? *minusColor : widgetbg);

        // text
        painter.setPen(textPen);
        constexpr int textY = 8;
        painter.drawText(contentX, textY, contentWidth, 12, Qt::AlignCenter, QStringLiteral("CH%1").arg(track + 1));

        xpos += trackWidth;
    }

    painter.setPen(mLinePen);
    painter.drawLine(xpos, 0, xpos, h);
    

}